

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.h
# Opt level: O2

void sse::common::zero<double>(double *pDst,int len)

{
  for (; 7 < len; len = len + -8) {
    pDst[6] = 0.0;
    pDst[7] = 0.0;
    pDst[4] = 0.0;
    pDst[5] = 0.0;
    pDst[2] = 0.0;
    pDst[3] = 0.0;
    *pDst = 0.0;
    pDst[1] = 0.0;
    pDst = pDst + 8;
  }
  if (3 < len) {
    len = len + -4;
    pDst[2] = 0.0;
    pDst[3] = 0.0;
    *pDst = 0.0;
    pDst[1] = 0.0;
    pDst = pDst + 4;
  }
  if (1 < len) {
    *pDst = 0.0;
    pDst[1] = 0.0;
    len = len + -2;
    pDst = pDst + 2;
  }
  if (len != 0) {
    *pDst = 0.0;
  }
  return;
}

Assistant:

_SIMD_SSE_T void zero(_T* pDst, int len)
        {
            set<_T>((_T)0, pDst, len);
        }